

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

ArgumentMismatch *
CLI::ArgumentMismatch::AtMost
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,size_t received)

{
  undefined8 *puVar1;
  size_type *psVar2;
  pointer pcVar3;
  bool bVar4;
  uint uVar5;
  char cVar6;
  undefined8 *puVar7;
  long *plVar8;
  uint uVar9;
  ulong *puVar10;
  size_t sVar11;
  ulong uVar12;
  uint __val;
  char cVar13;
  ulong uVar14;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  string __str_1;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  string local_b0;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_f0 = local_e0;
  pcVar3 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + name->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_f0);
  __val = -num;
  if (0 < num) {
    __val = num;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_00116c9b;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_00116c9b;
      }
      if (uVar9 < 10000) goto LAB_00116c9b;
      uVar12 = uVar12 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_00116c9b:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(num >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)num >> 0x1f) + (long)local_50),__len,__val);
  uVar12 = 0xf;
  if (local_f0 != local_e0) {
    uVar12 = local_e0[0];
  }
  if (uVar12 < (ulong)(local_48 + local_e8)) {
    uVar12 = 0xf;
    if (local_50 != local_40) {
      uVar12 = local_40[0];
    }
    if (uVar12 < (ulong)(local_48 + local_e8)) goto LAB_00116d24;
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00116d24:
    puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_50);
  }
  local_d0 = &local_c0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar7[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar7;
  }
  local_c8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_d0);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_60 = *puVar10;
    lStack_58 = plVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar10;
    local_70 = (ulong *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar13 = '\x01';
  if (9 < received) {
    sVar11 = received;
    cVar6 = '\x04';
    do {
      cVar13 = cVar6;
      if (sVar11 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_00116e45;
      }
      if (sVar11 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_00116e45;
      }
      if (sVar11 < 10000) goto LAB_00116e45;
      bVar4 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar6 = cVar13 + '\x04';
    } while (bVar4);
    cVar13 = cVar13 + '\x01';
  }
LAB_00116e45:
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct((ulong)&local_90,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,received);
  uVar12 = CONCAT44(uStack_84,local_88) + local_68;
  uVar14 = 0xf;
  if (local_70 != &local_60) {
    uVar14 = local_60;
  }
  if (uVar14 < uVar12) {
    uVar14 = 0xf;
    if (local_90 != local_80) {
      uVar14 = local_80[0];
    }
    if (uVar12 <= uVar14) {
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_00116ed4;
    }
  }
  puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_00116ed4:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar2 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_b0.field_2._M_allocated_capacity = *psVar2;
    local_b0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar2;
    local_b0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar2;
  puVar7[1] = 0;
  *(undefined1 *)psVar2 = 0;
  ArgumentMismatch(__return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch AtMost(std::string name, int num, std::size_t received) {
        return ArgumentMismatch(name + ": At Most " + std::to_string(num) + " required but received " +
                                std::to_string(received));
    }